

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
upb::generator::MultipleSourceFilename_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,FileDefPtr file,string_view full_name,
          int *i)

{
  char *__str;
  char *pcVar1;
  string_view fname;
  AlphaNum local_130;
  AlphaNum local_100;
  AlphaNum local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  string local_80;
  AlphaNum local_60;
  uint *local_30;
  int *i_local;
  string_view full_name_local;
  FileDefPtr file_local;
  
  local_30 = (uint *)full_name._M_str;
  full_name_local._M_len = full_name._M_len;
  pcVar1 = (char *)(ulong)(*local_30 + 1);
  *local_30 = *local_30 + 1;
  i_local = (int *)file.ptr_;
  full_name_local._M_str = (char *)this;
  __str = FileDefPtr::name((FileDefPtr *)&full_name_local._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,__str);
  fname._M_str = pcVar1;
  fname._M_len = (size_t)local_90._M_str;
  StripExtension_abi_cxx11_(&local_80,(generator *)local_90._M_len,fname);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_60,&local_80);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_d0,".upb_weak_minitables/");
  absl::lts_20240722::AlphaNum::AlphaNum(&local_100,*local_30);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_130,".upb.c");
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)__return_storage_ptr__,&local_60,&local_d0,&local_100);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string MultipleSourceFilename(upb::FileDefPtr file,
                                   absl::string_view full_name, int* i) {
  *i += 1;
  return absl::StrCat(StripExtension(file.name()), ".upb_weak_minitables/",
                      *i, ".upb.c");
}